

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

chunk * labyrinth_chunk(player *p,wchar_t h,wchar_t w,_Bool lit,_Bool soft)

{
  int iVar1;
  int iVar2;
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc grid_03;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  int16_t iVar8;
  wchar_t wVar9;
  chunk *pcVar10;
  void *p_00;
  loc lVar11;
  square *psVar12;
  ulong uVar13;
  loc_conflict lVar14;
  loc_conflict bottom_right;
  int *state;
  undefined7 in_register_00000009;
  wchar_t sa;
  size_t len;
  ulong uVar15;
  wchar_t wVar16;
  loc grid_04;
  undefined7 in_register_00000081;
  wchar_t *pwVar17;
  wchar_t sb;
  loc_conflict local_70;
  chunk *local_68;
  wchar_t local_60;
  undefined4 local_5c;
  ulong local_58;
  ulong local_50;
  wchar_t local_44;
  int *local_40;
  loc_conflict local_38;
  
  local_44 = (wchar_t)CONCAT71(in_register_00000081,soft);
  local_5c = (undefined4)CONCAT71(in_register_00000009,lit);
  pcVar10 = (chunk *)cave_new(h + L'\x02',w + L'\x02');
  pcVar10->depth = (int)p->depth;
  len = (long)(w * h) << 2;
  local_60 = w * h;
  p_00 = mem_zalloc(len);
  local_40 = (int *)mem_zalloc(len);
  pwVar17 = &FEAT_PERM;
  uVar15 = 0;
  local_68 = pcVar10;
  local_58 = (ulong)(uint)h;
  draw_rectangle(pcVar10,L'\0',L'\0',h + L'\x01',w + L'\x01',FEAT_PERM,L'\0',true);
  wVar9 = local_44;
  if (local_44 != L'\0') {
    wVar9 = L'\r';
    pwVar17 = &FEAT_GRANITE;
  }
  fill_rectangle(local_68,L'\x01',L'\x01',(wchar_t)local_58,w,*pwVar17,wVar9);
  local_50 = 0;
  if (L'\0' < local_60) {
    local_50 = (ulong)(uint)local_60;
  }
  for (; local_50 != uVar15; uVar15 = uVar15 + 1) {
    local_40[uVar15] = (int)uVar15;
    *(undefined4 *)((long)p_00 + uVar15 * 4) = 0xffffffff;
  }
  local_70.y = L'\0';
  while (local_70.y < (wchar_t)local_58) {
    wVar9 = local_70.y;
    for (wVar16 = L'\0'; iVar1 = local_70.y, local_70.x = wVar16, wVar16 < w;
        wVar16 = wVar16 + L'\x02') {
      lVar11.y = local_70.y;
      lVar11.x = wVar16;
      wVar9 = grid_to_i((loc_conflict)lVar11,w);
      lVar11 = next_grid(lVar11,L'\x03');
      pcVar10 = local_68;
      *(wchar_t *)((long)p_00 + (long)wVar9 * 4) = wVar9;
      square_set_feat((chunk_conflict *)local_68,lVar11,FEAT_FLOOR);
      if ((char)local_5c != '\0') {
        psVar12 = square((chunk_conflict *)pcVar10,lVar11);
        flag_on_dbg(psVar12->info,3,2,"square(c, diag)->info","SQUARE_GLOW");
      }
      wVar9 = iVar1;
    }
    local_70.y = wVar9 + L'\x02';
  }
  shuffle(local_40,local_60);
  local_58 = (ulong)((int)local_58 - 2);
  for (uVar15 = 0; uVar15 != local_50; uVar15 = uVar15 + 1) {
    wVar9 = local_40[uVar15];
    i_to_grid(wVar9,w,&local_70);
    if (((L'\0' < local_70.x || L'\0' < local_70.y) &&
        (local_70.x <= w + L'\xfffffffe' || local_70.y <= (wchar_t)local_58)) &&
       (local_70.x % 2 != local_70.y % 2)) {
      i_to_grid(wVar9,w,&local_38);
      grid_03._1_7_ = local_38._1_7_;
      grid_03.x._0_1_ = (byte)local_38.x;
      if (((byte)local_38.x & 1) == 0) {
        lVar11 = next_grid(grid_03,L'\b');
        wVar16 = grid_to_i((loc_conflict)lVar11,w);
        grid_04._1_7_ = local_38._1_7_;
        grid_04.x._0_1_ = (byte)local_38.x;
        wVar9 = L'\x02';
      }
      else {
        lVar11 = next_grid(grid_03,L'\x04');
        wVar16 = grid_to_i((loc_conflict)lVar11,w);
        grid_04._1_7_ = local_38._1_7_;
        grid_04.x._0_1_ = (byte)local_38.x;
        wVar9 = L'\x06';
      }
      lVar11 = next_grid(grid_04,wVar9);
      wVar9 = grid_to_i((loc_conflict)lVar11,w);
      iVar1 = *(int *)((long)p_00 + (long)wVar16 * 4);
      iVar2 = *(int *)((long)p_00 + (long)wVar9 * 4);
      if (iVar1 != iVar2) {
        grid.y = local_70.y;
        grid.x = local_70.x;
        lVar11 = next_grid(grid,L'\x03');
        square_set_feat((chunk_conflict *)local_68,lVar11,FEAT_FLOOR);
        if ((char)local_5c != '\0') {
          grid_00.y = local_70.y;
          grid_00.x = local_70.x;
          lVar11 = next_grid(grid_00,L'\x03');
          psVar12 = square((chunk_conflict *)local_68,lVar11);
          flag_on_dbg(psVar12->info,3,2,"square(c, next_grid(grid, DIR_SE))->info","SQUARE_GLOW");
        }
        for (uVar13 = 0; local_50 != uVar13; uVar13 = uVar13 + 1) {
          if (*(int *)((long)p_00 + uVar13 * 4) == iVar2) {
            *(int *)((long)p_00 + uVar13 * 4) = iVar1;
          }
        }
      }
    }
  }
  mem_free(p_00);
  mem_free(local_40);
  lVar14 = loc(1,1);
  bottom_right = loc(local_68->width + L'\xfffffffe',local_68->height + L'\xfffffffe');
  state = cave_find_init(lVar14,bottom_right);
  uVar15 = (long)local_60 / 100 & 0xffffffff;
  do {
    local_50 = CONCAT44(local_50._4_4_,(int)uVar15);
    do {
      do {
        if (((int)uVar15 < 1) || (_Var3 = cave_find_get_grid(&local_70,state), !_Var3)) {
          mem_free(state);
          if ((char)local_5c == '\0') {
            iVar8 = Rand_normal(3,2);
            alloc_objects((chunk_conflict *)local_68,L'\x03',L'\x04',(int)iVar8,local_68->depth,
                          '\x06');
          }
          pcVar10 = local_68;
          if ((char)local_44 == '\0') {
            iVar8 = Rand_normal(2,1);
            alloc_objects((chunk_conflict *)pcVar10,L'\x03',L'\x05',(int)iVar8,pcVar10->depth,'\x06'
                         );
          }
          return pcVar10;
        }
        grid_01.y = local_70.y;
        grid_01.x = local_70.x;
        _Var3 = square_isempty((chunk_conflict *)local_68,grid_01);
      } while (!_Var3);
      grid_02.y = local_70.y;
      grid_02.x = local_70.x;
      lVar11 = next_grid(grid_02,L'\x04');
      pcVar10 = local_68;
      _Var4 = square_ispassable((chunk_conflict *)local_68,lVar11);
      _Var3 = true;
      if (!_Var4) {
        lVar11 = next_grid(grid_02,L'\x04');
        _Var3 = square_iscloseddoor((chunk_conflict *)pcVar10,lVar11);
      }
      lVar11 = next_grid(grid_02,L'\x06');
      _Var5 = square_ispassable((chunk_conflict *)pcVar10,lVar11);
      _Var4 = true;
      if (!_Var5) {
        lVar11 = next_grid(grid_02,L'\x06');
        _Var4 = square_iscloseddoor((chunk_conflict *)pcVar10,lVar11);
      }
      lVar11 = next_grid(grid_02,L'\b');
      _Var6 = square_ispassable((chunk_conflict *)pcVar10,lVar11);
      _Var5 = true;
      if (!_Var6) {
        lVar11 = next_grid(grid_02,L'\b');
        _Var5 = square_iscloseddoor((chunk_conflict *)pcVar10,lVar11);
      }
      lVar11 = next_grid(grid_02,L'\x02');
      _Var6 = square_ispassable((chunk_conflict *)pcVar10,lVar11);
      _Var7 = true;
      if (!_Var6) {
        lVar11 = next_grid(grid_02,L'\x02');
        _Var7 = square_iscloseddoor((chunk_conflict *)local_68,lVar11);
      }
      iVar1 = (int)local_50;
      uVar15 = local_50 & 0xffffffff;
    } while (((_Var5 != _Var7) || (_Var3 != _Var4)) || (_Var5 == _Var3));
    lVar14.y = local_70.y;
    lVar14.x = local_70.x;
    place_closed_door((chunk_conflict *)local_68,lVar14);
    uVar15 = (ulong)(iVar1 - 1);
  } while( true );
}

Assistant:

static struct chunk *labyrinth_chunk(struct player *p, int h, int w, bool lit,
									 bool soft)
{
	int i, j, k;
	struct loc grid;
	int *find_state;

	/* This is the number of squares in the labyrinth */
	int n = h * w;

	/* NOTE: 'sets' and 'walls' are too large... we only need to use about
	 * 1/4 as much memory. However, in that case, the addressing math
	 * becomes a lot more complicated, so let's just stick with this
	 * because it's easier to read. */

	/* 'sets' tracks connectedness; if sets[i] == sets[j] then cells i and j
	 * are connected to each other in the maze. */
	int *sets;

	/* 'walls' is a list of wall coordinates which we will randomize */
	int *walls;

	/* The labyrinth chunk */
	struct chunk *c = cave_new(h + 2, w + 2);
	c->depth = p->depth;
	/* allocate our arrays */
	sets = mem_zalloc(n * sizeof(int));
	walls = mem_zalloc(n * sizeof(int));

	/* Bound with perma-rock */
	draw_rectangle(c, 0, 0, h + 1, w + 1, FEAT_PERM, SQUARE_NONE, true);

	/* Fill the labyrinth area with rock */
	if (soft)
		fill_rectangle(c, 1, 1, h, w, FEAT_GRANITE, SQUARE_WALL_SOLID);
	else
		fill_rectangle(c, 1, 1, h, w, FEAT_PERM, SQUARE_NONE);

	/* Initialize each wall. */
	for (i = 0; i < n; i++) {
		walls[i] = i;
		sets[i] = -1;
	}

	/* Cut out a grid of 1x1 rooms which we will call "cells" */
	for (grid.y = 0; grid.y < h; grid.y += 2) {
		for (grid.x = 0; grid.x < w; grid.x += 2) {
			int k_local = grid_to_i(grid, w);
			struct loc diag = next_grid(grid, DIR_SE);
			sets[k_local] = k_local;
			square_set_feat(c, diag, FEAT_FLOOR);
			if (lit) sqinfo_on(square(c, diag)->info, SQUARE_GLOW);
		}
	}

	/* Shuffle the walls, using Knuth's shuffle. */
	shuffle(walls, n);

	/* For each adjoining wall, look at the cells it divides. If they aren't
	 * in the same set, remove the wall and join their sets.
	 *
	 * This is a randomized version of Kruskal's algorithm. */
	for (i = 0; i < n; i++) {
		int a, b;

		j = walls[i];

		/* If this cell isn't an adjoining wall, skip it */
		i_to_grid(j, w, &grid);
		if ((grid.x < 1 && grid.y < 1) || (grid.x > w - 2 && grid.y > h - 2))
			continue;
		if (grid.x % 2 == grid.y % 2) continue;

		/* Figure out which cells are separated by this wall */
		lab_get_adjoin(j, w, &a, &b);

		/* If the cells aren't connected, kill the wall and join the sets */
		if (sets[a] != sets[b]) {
			int sa = sets[a];
			int sb = sets[b];
			square_set_feat(c, next_grid(grid, DIR_SE), FEAT_FLOOR);
			if (lit) {
				sqinfo_on(square(c, next_grid(grid, DIR_SE))->info, SQUARE_GLOW);
			}
			for (k = 0; k < n; k++) {
				if (sets[k] == sb) sets[k] = sa;
			}
		}
	}

	/* Deallocate our lists */
	mem_free(sets);
	mem_free(walls);

	/* Generate a door for every 100 squares in the labyrinth */
	find_state = cave_find_init(loc(1, 1),
		loc(c->width - 2, c->height - 2));
	i = n / 100;
	while (i > 0 && cave_find_get_grid(&grid, find_state)) {
		if (square_isempty(c, grid) && lab_is_tunnel(c, grid)) {
			place_closed_door(c, grid);
			--i;
		}
	}
	mem_free(find_state);

	/* Unlit labyrinths will have some good items */
	if (!lit)
		alloc_objects(c, SET_BOTH, TYP_GOOD, Rand_normal(3, 2),
			c->depth, ORIGIN_LABYRINTH);

	/* Hard (non-diggable) labyrinths will have some great items */
	if (!soft)
		alloc_objects(c, SET_BOTH, TYP_GREAT, Rand_normal(2, 1),
			c->depth, ORIGIN_LABYRINTH);

	return c;
}